

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTcSymLocal::gen_code_call
          (CTcSymLocal *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  size_t __n;
  CTcGenTarg *pCVar3;
  undefined8 uStack_28;
  
  __n = CONCAT44(in_register_0000000c,varargs);
  uStack_28 = in_RAX;
  (*(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry._vptr_CVmHashEntry[0x18])(this,0);
  if (varargs != 0) {
    CTcGenTarg::write_op(G_cg,0x8d);
    CTcGenTarg::write_op(G_cg,'v');
  }
  if ((~G_cg->field_0xd0 & 0x18) != 0) {
    CTcGenTarg::write_op(G_cg,'Y');
    uStack_28 = CONCAT17((char)argc,(undefined7)uStack_28);
    pCVar3 = (CTcGenTarg *)G_cs;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_28 + 7,(void *)0x1,__n);
    G_cg->sp_depth_ = G_cg->sp_depth_ + ~argc;
    CTcGenTarg::post_call_cleanup(pCVar3,named_args);
    if (discard == 0) {
      CTcGenTarg::write_op(G_cg,0x8b);
      pCVar3 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar3->max_sp_depth_ <= iVar2) {
        pCVar3->max_sp_depth_ = iVar1;
      }
    }
    return;
  }
  err_throw(0x9c5);
}

Assistant:

void CTcSymLocal::gen_code_call(
    int discard, int argc, int varargs, CTcNamedArgs *named_args)
{
    /* 
     *   to call a local, we'll simply evaluate the local normally, then
     *   call through the resulting (presumed) property or function
     *   pointer value 
     */
    gen_code(FALSE);

    /* 
     *   if we have a varargs list, modify the call instruction that
     *   follows to make it a varargs call 
     */
    if (varargs)
    {
        /* swap the top of the stack to get the arg counter back on top */
        G_cg->write_op(OPC_SWAP);

        /* write the varargs modifier */
        G_cg->write_op(OPC_VARARGC);
    }

    /* don't allow this at all in speculative mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* call the result as a function or method pointer */
    G_cg->write_op(OPC_PTRCALL);
    G_cs->write((char)argc);

    /* ptrcall removes the arguments and the function pointer */
    G_cg->note_pop(argc + 1);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding the value, push the result */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}